

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXModel.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Model::ResolveLinks(Model *this,Element *element,Document *doc)

{
  Object *pOVar1;
  pointer ppCVar2;
  allocator<char> local_b1;
  Element *local_b0;
  Material *mat;
  _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  local_a0;
  vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_> *local_88;
  vector<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_> *local_80;
  NodeAttribute *att;
  Geometry *geo;
  string local_68;
  char *arr [3];
  
  arr[2] = "NodeAttribute";
  arr[0] = "Geometry";
  arr[1] = "Material";
  local_b0 = element;
  Document::GetConnectionsByDestinationSequenced
            ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)&local_a0,doc,(this->super_Object).id,arr,3);
  local_80 = &this->materials;
  std::vector<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>::
  reserve(local_80,(long)local_a0._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_a0._M_impl.super__Vector_impl_data._M_start >> 3);
  local_88 = &this->geometry;
  std::vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>::
  reserve(local_88,(long)local_a0._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_a0._M_impl.super__Vector_impl_data._M_start >> 3);
  std::
  vector<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>::
  reserve(&this->attributes,
          (long)local_a0._M_impl.super__Vector_impl_data._M_finish -
          (long)local_a0._M_impl.super__Vector_impl_data._M_start >> 3);
  ppCVar2 = local_a0._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppCVar2 == local_a0._M_impl.super__Vector_impl_data._M_finish) {
      std::
      _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ::~_Vector_base(&local_a0);
      return;
    }
    if (((*ppCVar2)->prop)._M_string_length == 0) {
      pOVar1 = Connection::SourceObject(*ppCVar2);
      if (pOVar1 == (Object *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,
                   "failed to read source object for incoming Model link, ignoring",
                   (allocator<char> *)&mat);
        Util::DOMWarning(&local_68,local_b0);
LAB_00530b82:
        std::__cxx11::string::~string((string *)&local_68);
      }
      else {
        mat = (Material *)__dynamic_cast(pOVar1,&Object::typeinfo,&FBX::Material::typeinfo,0);
        if (mat == (Material *)0x0) {
          geo = (Geometry *)__dynamic_cast(pOVar1,&Object::typeinfo,&Geometry::typeinfo,0);
          if (geo == (Geometry *)0x0) {
            att = (NodeAttribute *)
                  __dynamic_cast(pOVar1,&Object::typeinfo,&NodeAttribute::typeinfo,0);
            if (att == (NodeAttribute *)0x0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_68,
                         "source object for model link is neither Material, NodeAttribute nor Geometry, ignoring"
                         ,&local_b1);
              Util::DOMWarning(&local_68,local_b0);
              goto LAB_00530b82;
            }
            std::
            vector<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
            ::push_back(&this->attributes,&att);
          }
          else {
            std::
            vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>::
            push_back(local_88,&geo);
          }
        }
        else {
          std::vector<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>
          ::push_back(local_80,&mat);
        }
      }
    }
    ppCVar2 = ppCVar2 + 1;
  } while( true );
}

Assistant:

void Model::ResolveLinks(const Element& element, const Document& doc)
{
    const char* const arr[] = {"Geometry","Material","NodeAttribute"};

    // resolve material
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID(),arr, 3);

    materials.reserve(conns.size());
    geometry.reserve(conns.size());
    attributes.reserve(conns.size());
    for(const Connection* con : conns) {

        // material and geometry links should be Object-Object connections
        if (con->PropertyName().length()) {
            continue;
        }

        const Object* const ob = con->SourceObject();
        if(!ob) {
            DOMWarning("failed to read source object for incoming Model link, ignoring",&element);
            continue;
        }

        const Material* const mat = dynamic_cast<const Material*>(ob);
        if(mat) {
            materials.push_back(mat);
            continue;
        }

        const Geometry* const geo = dynamic_cast<const Geometry*>(ob);
        if(geo) {
            geometry.push_back(geo);
            continue;
        }

        const NodeAttribute* const att = dynamic_cast<const NodeAttribute*>(ob);
        if(att) {
            attributes.push_back(att);
            continue;
        }

        DOMWarning("source object for model link is neither Material, NodeAttribute nor Geometry, ignoring",&element);
        continue;
    }
}